

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

BasicBlock * __thiscall spvtools::opt::Loop::FindConditionBlock(Loop *this)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  uint32_t uVar4;
  CFG *pCVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar6;
  undefined1 local_60 [16];
  Instruction *branch;
  BasicBlock *bb;
  const_iterator cStack_40;
  uint32_t p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  uint32_t in_loop_pred;
  BasicBlock *condition_block;
  Loop *this_local;
  
  if (this->loop_merge_ == (BasicBlock *)0x0) {
    return (BasicBlock *)0x0;
  }
  __range2._4_4_ = 0;
  pCVar5 = IRContext::cfg(this->context_);
  uVar2 = BasicBlock::id(this->loop_merge_);
  this_00 = CFG::preds(pCVar5,uVar2);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
  cStack_40 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc0), bVar1) {
    puVar6 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    bb._4_4_ = *puVar6;
    bVar1 = IsInsideLoop(this,bb._4_4_);
    if (bVar1) {
      if (__range2._4_4_ != 0) {
        return (BasicBlock *)0x0;
      }
      __range2._4_4_ = bb._4_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  if (__range2._4_4_ == 0) {
    return (BasicBlock *)0x0;
  }
  pCVar5 = IRContext::cfg(this->context_);
  branch = (Instruction *)CFG::block(pCVar5,__range2._4_4_);
  if ((BasicBlock *)branch == (BasicBlock *)0x0) {
    return (BasicBlock *)0x0;
  }
  BasicBlock::ctail((BasicBlock *)local_60);
  local_60._8_8_ =
       utils::IntrusiveList<spvtools::opt::Instruction>::
       iterator_template<const_spvtools::opt::Instruction>::operator*
                 ((iterator_template<const_spvtools::opt::Instruction> *)local_60);
  OVar3 = Instruction::opcode((Instruction *)local_60._8_8_);
  if (OVar3 == OpBranchConditional) {
    uVar2 = Instruction::GetSingleWordInOperand((Instruction *)local_60._8_8_,1);
    uVar4 = BasicBlock::id(this->loop_merge_);
    if (uVar2 != uVar4) {
      uVar2 = Instruction::GetSingleWordInOperand((Instruction *)local_60._8_8_,2);
      uVar4 = BasicBlock::id(this->loop_merge_);
      if (uVar2 != uVar4) {
        return (BasicBlock *)0x0;
      }
    }
    return (BasicBlock *)branch;
  }
  return (BasicBlock *)0x0;
}

Assistant:

BasicBlock* Loop::FindConditionBlock() const {
  if (!loop_merge_) {
    return nullptr;
  }
  BasicBlock* condition_block = nullptr;

  uint32_t in_loop_pred = 0;
  for (uint32_t p : context_->cfg()->preds(loop_merge_->id())) {
    if (IsInsideLoop(p)) {
      if (in_loop_pred) {
        // 2 in-loop predecessors.
        return nullptr;
      }
      in_loop_pred = p;
    }
  }
  if (!in_loop_pred) {
    // Merge block is unreachable.
    return nullptr;
  }

  BasicBlock* bb = context_->cfg()->block(in_loop_pred);

  if (!bb) return nullptr;

  const Instruction& branch = *bb->ctail();

  // Make sure the branch is a conditional branch.
  if (branch.opcode() != spv::Op::OpBranchConditional) return nullptr;

  // Make sure one of the two possible branches is to the merge block.
  if (branch.GetSingleWordInOperand(1) == loop_merge_->id() ||
      branch.GetSingleWordInOperand(2) == loop_merge_->id()) {
    condition_block = bb;
  }

  return condition_block;
}